

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

MainBuilder * __thiscall
kj::MainBuilder::addOption
          (MainBuilder *this,initializer_list<kj::MainBuilder::OptionName> names,
          Function<kj::MainBuilder::Validity_()> *callback,StringPtr helpText)

{
  Impl *pIVar1;
  Function<kj::MainBuilder::Validity_()> *pFVar2;
  Option *pOVar3;
  Function<kj::MainBuilder::Validity_()> *callback_local;
  MainBuilder *this_local;
  StringPtr helpText_local;
  initializer_list<kj::MainBuilder::OptionName> names_local;
  
  pIVar1 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
  pFVar2 = mv<kj::Function<kj::MainBuilder::Validity()>>(callback);
  pFVar2 = Arena::copy<kj::Function<kj::MainBuilder::Validity()>>(&pIVar1->arena,pFVar2);
  pIVar1 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
  pOVar3 = Impl::addOption(pIVar1,names,false,helpText);
  (pOVar3->field_2).func = pFVar2;
  return this;
}

Assistant:

MainBuilder& MainBuilder::addOption(std::initializer_list<OptionName> names,
                                    Function<Validity()> callback,
                                    StringPtr helpText) {
  impl->addOption(names, false, helpText).func = &impl->arena.copy(kj::mv(callback));
  return *this;
}